

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,double *points_z,
             double dist,double *empty_cubs,int *empty_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int m;
  long lVar7;
  int j;
  ulong uVar8;
  int k;
  ulong uVar9;
  
  *empty_index = 0;
  uVar6 = 0;
  uVar4 = 0;
  if (0 < step) {
    uVar4 = (ulong)(uint)step;
  }
  iVar5 = 0;
  do {
    if (uVar6 == uVar4) {
      return;
    }
    dVar1 = AAA[uVar6];
    for (uVar8 = 0; uVar8 != (uint)step; uVar8 = uVar8 + 1) {
      dVar2 = AAA[uVar8];
      for (uVar9 = 0; uVar9 != (uint)step; uVar9 = uVar9 + 1) {
        for (lVar7 = 0; lVar7 <= hit; lVar7 = lVar7 + 1) {
          if ((((dVar1 <= points_x[lVar7]) && (points_x[lVar7] <= dVar1 + dist)) &&
              (dVar2 <= points_y[lVar7])) &&
             (((points_y[lVar7] <= dVar2 + dist && (AAA[uVar9] <= points_z[lVar7])) &&
              (points_z[lVar7] <= AAA[uVar9] + dist)))) goto LAB_0010aa90;
        }
        empty_cubs[iVar5] = AAA[uVar6];
        empty_cubs[(long)iVar5 + 1] = AAA[uVar8];
        dVar3 = AAA[uVar9];
        *empty_index = iVar5 + 3;
        empty_cubs[(long)iVar5 + 2] = dVar3;
        iVar5 = iVar5 + 3;
LAB_0010aa90:
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,
			  double *points_z,double dist,double *empty_cubs,int &empty_index)
{
	double x,y,z;
	int check;
	empty_index=0;
	for (int i = 0; i < step; i++)
	{
		x=AAA[i];
		for (int j = 0; j < step; j++)
		{
			y=AAA[j];
			for (int k = 0; k < step; k++)
			{
				z=AAA[k];
				check=0;
				for (int m = 0; m <= hit; m++)
				{
					if (points_x[m]>= x &&points_x[m]<= x+dist)
					{
						if (points_y[m]>=y &&points_y[m]<= y+dist)
						{
							if (points_z[m]>=z &&points_z[m]<= z+dist)
							{
								check=1;
								break;
							}

						}

					}

				}
				if (check==0)
				{
					empty_cubs[empty_index++]=AAA[i];
					empty_cubs[empty_index++]=AAA[j];
					empty_cubs[empty_index++]=AAA[k];
				}
			}

		}

	}
}